

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *src;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  Option *pOVar10;
  pointer pMVar11;
  int ref_w;
  long lVar12;
  uint *puVar13;
  void *pvVar14;
  long lVar15;
  uint *puVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  uint *puVar22;
  uint *puVar23;
  int ref_h;
  int h;
  int _woffset;
  int _hoffset;
  int _outw;
  int _outh;
  int _coffset;
  int _outc;
  int _outd;
  int _doffset;
  Mat m;
  Mat m_1;
  uint local_16c [5];
  uint *local_158;
  pointer local_150;
  size_t local_148;
  Option *local_140;
  uint local_138;
  uint local_134;
  uint *local_130;
  uint *local_128;
  uint local_11c;
  Mat local_118;
  void *local_d0;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  uint local_98;
  ulong local_90;
  Mat local_88;
  uint *local_40;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  iVar3 = src->w;
  uVar1 = src->h;
  uVar17 = src->c;
  iVar7 = src->dims;
  local_148 = src->elemsize;
  local_150 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_16c[4] = -1;
  local_16c[2] = -1;
  local_16c[3] = 0xffffffff;
  local_134 = 0xffffffff;
  local_128 = (uint *)CONCAT44(local_128._4_4_,src->d);
  local_140 = opt;
  if (this->woffset == -0xe9) {
    switch(iVar7 + -1) {
    case 0:
      puVar5 = (uint *)src[1].data;
      puVar22 = local_16c + 2;
      lVar15 = 0xc;
      puVar16 = local_16c;
      puVar9 = puVar5;
      goto LAB_001b80e8;
    case 1:
      puVar5 = (uint *)src[1].data;
      puVar22 = local_16c + 3;
      lVar15 = 0x10;
      puVar16 = local_16c + 2;
      lVar8 = 0xc;
      puVar9 = local_16c + 1;
      lVar20 = 4;
      puVar23 = local_16c;
      puVar13 = puVar5;
      goto LAB_001b80d7;
    case 2:
      puVar22 = (uint *)src[1].data;
      lVar15 = 0x14;
      puVar16 = local_16c + 3;
      lVar8 = 0x10;
      local_130 = local_16c + 2;
      lVar20 = 0xc;
      puVar23 = local_16c + 4;
      lVar12 = 8;
      puVar9 = local_16c + 1;
      lVar18 = 4;
      puVar13 = local_16c;
      puVar5 = puVar22;
      break;
    case 3:
      puVar5 = (uint *)src[1].data;
      local_16c[0] = *puVar5;
      local_16c[1] = puVar5[1];
      puVar22 = puVar5 + 2;
      lVar15 = 0x1c;
      puVar16 = &local_134;
      lVar8 = 0x18;
      local_130 = local_16c + 3;
      lVar20 = 0x14;
      puVar23 = local_16c + 2;
      lVar12 = 0x10;
      puVar9 = local_16c + 4;
      lVar18 = 0xc;
      puVar13 = &local_11c;
      break;
    default:
      goto LAB_001b8c77;
    }
    local_158 = (uint *)CONCAT44(local_158._4_4_,uVar17);
    *puVar13 = *puVar22;
    *puVar9 = *(uint *)((long)puVar5 + lVar18);
    puVar22 = &local_138;
    puVar13 = (uint *)(lVar12 + (long)puVar5);
    puVar9 = local_130;
    uVar17 = (uint)local_158;
LAB_001b80d7:
    *puVar23 = *puVar13;
    *puVar9 = *(uint *)((long)puVar5 + lVar20);
    puVar9 = (uint *)(lVar8 + (long)puVar5);
LAB_001b80e8:
    *puVar16 = *puVar9;
    *puVar22 = *(uint *)((long)puVar5 + lVar15);
    goto LAB_001b825f;
  }
  iVar6 = iVar7;
  switch(iVar7 + -1) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    iVar6 = 3;
    break;
  case 3:
    iVar6 = 4;
    break;
  default:
    iVar6 = 0;
  }
  switch(src[1].dims) {
  case 1:
    goto LAB_001b8190;
  case 2:
LAB_001b8190:
    iVar19 = 1;
    break;
  case 3:
    iVar19 = src[1].elempack * src[1].c;
    break;
  case 4:
    iVar19 = src[1].elempack * src[1].c;
    break;
  default:
    iVar19 = 0;
  }
  if (iVar6 - 1U < 4) {
    local_158 = (uint *)CONCAT44(local_158._4_4_,iVar19);
    iVar3 = (*(code *)(&DAT_00315c60 + *(int *)(&DAT_00315c60 + (ulong)(iVar6 - 1U) * 4)))();
    return iVar3;
  }
LAB_001b825f:
  pMVar11 = local_150;
  switch(iVar7) {
  case 1:
    if (local_16c[2] != iVar3) {
      Mat::create(local_150,local_16c[2],local_148,local_140->blob_allocator);
      if (pMVar11->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar11->c * pMVar11->cstep == 0) {
        return -100;
      }
      if (local_148 == 4) {
        copy_cut_border_image<float>(src,pMVar11,0,local_16c[0]);
        return 0;
      }
      if (local_148 == 2) {
        copy_cut_border_image<unsigned_short>(src,pMVar11,0,local_16c[0]);
        return 0;
      }
      if (local_148 == 1) {
        copy_cut_border_image<signed_char>(src,pMVar11,0,local_16c[0]);
        return 0;
      }
      return 0;
    }
    break;
  case 2:
    if (uVar1 != local_16c[3] || iVar3 != local_16c[2]) {
      Mat::create(local_150,local_16c[2],local_16c[3],local_148,local_140->blob_allocator);
      if (pMVar11->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar11->c * pMVar11->cstep == 0) {
        return -100;
      }
      if (local_148 == 4) {
        copy_cut_border_image<float>(src,pMVar11,local_16c[1],local_16c[0]);
        return 0;
      }
      if (local_148 != 2) {
        if (local_148 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(src,pMVar11,local_16c[1],local_16c[0]);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(src,pMVar11,local_16c[1],local_16c[0]);
      return 0;
    }
    break;
  case 3:
    if (local_138 != uVar17 || (uVar1 != local_16c[3] || iVar3 != local_16c[2])) {
      local_a4 = src->w;
      local_a0 = src->h;
      if (src->dims == 3) {
        local_c0 = src->elemsize;
        local_d0 = (void *)((long)(int)local_16c[4] * src->cstep * local_c0 + (long)src->data);
        lVar8 = (long)local_a0 * (long)local_a4 * local_c0;
        local_9c = 1;
        local_a8 = 3;
      }
      else {
        local_9c = src->d;
        local_c0 = src->elemsize;
        local_d0 = (void *)((long)(int)local_16c[4] * src->cstep * local_c0 + (long)src->data);
        lVar8 = (long)local_a0 * (long)local_a4 * (long)local_9c * local_c0;
        local_a8 = 4;
      }
      local_b0 = src->allocator;
      local_b8 = src->elempack;
      local_c8 = (int *)0x0;
      local_90 = (lVar8 + 0xfU & 0xfffffffffffffff0) / local_c0;
      local_98 = local_138;
      if (uVar1 != local_16c[3] || iVar3 != local_16c[2]) {
        Mat::create(local_150,local_16c[2],local_16c[3],local_138,local_148,
                    local_140->blob_allocator);
        iVar3 = -100;
        if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
          if (0 < (int)local_138) {
            local_158 = (uint *)(ulong)local_138;
            puVar22 = (uint *)0x0;
            do {
              local_88.c = 1;
              local_118.c = 1;
              if (local_a8 != 3) {
                local_118.c = local_9c;
              }
              lVar8 = (long)local_a4;
              local_118.dims = local_a8 == 3 ^ 3;
              local_118.data = (void *)(local_90 * (long)puVar22 * local_c0 + (long)local_d0);
              local_118.refcount = (int *)0x0;
              local_118.elemsize = local_c0;
              local_118.elempack = local_b8;
              local_118.allocator = local_b0;
              local_118.w = local_a4;
              local_118.h = local_a0;
              local_118.cstep = local_a0 * lVar8;
              local_118.d = 1;
              local_88.dims = 2;
              if (pMVar11->dims != 3) {
                local_88.c = pMVar11->d;
                local_88.dims = 3;
              }
              uVar1 = pMVar11->w;
              pOVar10 = (Option *)(long)(int)uVar1;
              iVar3 = pMVar11->h;
              local_88.elemsize = pMVar11->elemsize;
              pvVar21 = (void *)(pMVar11->cstep * (long)puVar22 * local_88.elemsize +
                                (long)pMVar11->data);
              local_88.elempack = pMVar11->elempack;
              local_88.allocator = pMVar11->allocator;
              local_88.refcount = (int *)0x0;
              local_88.cstep = (long)iVar3 * (long)pOVar10;
              local_88.d = 1;
              local_128 = puVar22;
              local_88.data = pvVar21;
              local_88.w = uVar1;
              local_88.h = iVar3;
              if (local_148 == 4) {
                copy_cut_border_image<float>(&local_118,&local_88,local_16c[1],local_16c[0]);
              }
              else if (local_148 == 2) {
                copy_cut_border_image<unsigned_short>
                          (&local_118,&local_88,local_16c[1],local_16c[0]);
              }
              else if ((local_148 == 1) && (0 < iVar3)) {
                pvVar14 = (void *)((long)local_118.data +
                                  local_c0 * lVar8 * (long)(int)local_16c[1] +
                                  (long)(int)local_16c[0]);
                iVar7 = 0;
                local_140 = pOVar10;
                do {
                  if ((int)uVar1 < 0xc) {
                    if (0 < (int)uVar1) {
                      uVar4 = 0;
                      do {
                        *(undefined1 *)((long)pvVar21 + uVar4) =
                             *(undefined1 *)((long)pvVar14 + uVar4);
                        uVar4 = uVar4 + 1;
                      } while (uVar1 != uVar4);
                    }
                  }
                  else {
                    memcpy(pvVar21,pvVar14,(ulong)uVar1);
                    pOVar10 = local_140;
                  }
                  pvVar21 = (void *)((long)pvVar21 + (long)pOVar10);
                  pvVar14 = (void *)((long)pvVar14 + lVar8);
                  iVar7 = iVar7 + 1;
                } while (iVar7 != iVar3);
              }
              puVar22 = (uint *)((long)local_128 + 1);
              pMVar11 = local_150;
            } while (puVar22 < local_158);
          }
          goto LAB_001b8d80;
        }
      }
      else {
        Mat::clone(&local_118,(__fn *)&local_d0,(void *)0x0,local_a4,(void *)(ulong)local_16c[3]);
        pMVar11 = local_150;
        if (local_150 != &local_118) {
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + 1;
            UNLOCK();
          }
          piVar2 = local_150->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar11->data = local_118.data;
          pMVar11->refcount = local_118.refcount;
          pMVar11->elemsize = local_118.elemsize;
          pMVar11->elempack = local_118.elempack;
          pMVar11->allocator = local_118.allocator;
          pMVar11->dims = local_118.dims;
          pMVar11->w = local_118.w;
          pMVar11->h = local_118.h;
          pMVar11->d = local_118.d;
          pMVar11->c = local_118.c;
          pMVar11->cstep = local_118.cstep;
        }
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + -1;
          UNLOCK();
          if (*local_118.refcount == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              if (local_118.data != (void *)0x0) {
                free(local_118.data);
              }
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0)) {
          iVar3 = -100;
        }
        else {
LAB_001b8d80:
          iVar3 = 0;
        }
      }
      if (local_c8 == (int *)0x0) {
        return iVar3;
      }
      LOCK();
      *local_c8 = *local_c8 + -1;
      UNLOCK();
      if (*local_c8 != 0) {
        return iVar3;
      }
      if (local_b0 != (Allocator *)0x0) {
        (*local_b0->_vptr_Allocator[3])();
        return iVar3;
      }
LAB_001b8eab:
      if (local_d0 != (void *)0x0) {
        free(local_d0);
        return iVar3;
      }
      return iVar3;
    }
    goto LAB_001b83a7;
  case 4:
    if (local_138 != uVar17 ||
        ((uint)local_128 != local_134 || (uVar1 != local_16c[3] || iVar3 != local_16c[2]))) {
      local_a4 = src->w;
      local_a0 = src->h;
      if (src->dims == 3) {
        local_d0 = (void *)((long)(int)local_16c[4] * src->cstep * local_148 + (long)src->data);
        lVar8 = (long)local_a0 * (long)local_a4;
        local_9c = 1;
        local_a8 = 3;
      }
      else {
        local_d0 = (void *)((long)(int)local_16c[4] * src->cstep * local_148 + (long)src->data);
        local_9c = src->d;
        lVar8 = (long)local_a0 * (long)local_a4 * (long)local_9c;
        local_a8 = 4;
      }
      local_b0 = src->allocator;
      local_b8 = src->elempack;
      local_c8 = (int *)0x0;
      local_c0 = local_148;
      local_90 = (lVar8 * local_148 + 0xf & 0xfffffffffffffff0) / local_148;
      local_98 = local_138;
      if ((uint)local_128 != local_134 || (uVar1 != local_16c[3] || iVar3 != local_16c[2])) {
        local_130 = (uint *)(ulong)local_134;
        Mat::create(local_150,local_16c[2],local_16c[3],local_134,local_138,local_148,
                    local_140->blob_allocator);
        iVar3 = -100;
        if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
          if (0 < (int)local_138) {
            local_40 = (uint *)(ulong)local_138;
            local_38 = (long)(int)local_11c;
            local_158 = (uint *)0x0;
            do {
              if (0 < (int)local_130) {
                puVar22 = (uint *)0x0;
                do {
                  local_140 = (Option *)(long)local_a4;
                  local_118.cstep = (long)local_a0 * (long)local_140;
                  local_118.data =
                       (void *)((long)local_d0 +
                               ((int)puVar22 + local_38) * local_c0 * local_118.cstep +
                               local_90 * (long)local_158 * local_c0);
                  local_118.refcount = (int *)0x0;
                  local_118.elemsize = local_c0;
                  local_118.elempack = local_b8;
                  local_118.allocator = local_b0;
                  local_118.dims = 2;
                  local_118.w = local_a4;
                  local_118.h = local_a0;
                  local_118.d = 1;
                  local_118.c = 1;
                  uVar1 = pMVar11->w;
                  local_88.elemsize = pMVar11->elemsize;
                  iVar3 = pMVar11->h;
                  local_88.elempack = pMVar11->elempack;
                  local_88.cstep = (long)iVar3 * (long)(int)uVar1;
                  pvVar21 = (void *)((long)pMVar11->data +
                                    (long)puVar22 * local_88.elemsize * local_88.cstep +
                                    pMVar11->cstep * (long)local_158 * local_88.elemsize);
                  local_88.allocator = pMVar11->allocator;
                  local_88.refcount = (int *)0x0;
                  local_88.dims = 2;
                  local_88.d = 1;
                  local_88.c = 1;
                  local_128 = puVar22;
                  local_88.data = pvVar21;
                  local_88.w = uVar1;
                  local_88.h = iVar3;
                  if (local_148 == 4) {
                    copy_cut_border_image<float>(&local_118,&local_88,local_16c[1],local_16c[0]);
                  }
                  else if (local_148 == 2) {
                    copy_cut_border_image<unsigned_short>
                              (&local_118,&local_88,local_16c[1],local_16c[0]);
                  }
                  else if ((local_148 == 1) && (0 < iVar3)) {
                    pvVar14 = (void *)((long)local_118.data +
                                      (long)(int)local_16c[1] * (long)local_140 * local_c0 +
                                      (long)(int)local_16c[0]);
                    iVar7 = 0;
                    do {
                      if ((int)uVar1 < 0xc) {
                        if (0 < (int)uVar1) {
                          uVar4 = 0;
                          do {
                            *(undefined1 *)((long)pvVar21 + uVar4) =
                                 *(undefined1 *)((long)pvVar14 + uVar4);
                            uVar4 = uVar4 + 1;
                          } while (uVar1 != uVar4);
                        }
                      }
                      else {
                        memcpy(pvVar21,pvVar14,(ulong)uVar1);
                      }
                      pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar1);
                      pvVar14 = (void *)((long)pvVar14 + (long)local_140);
                      iVar7 = iVar7 + 1;
                    } while (iVar7 != iVar3);
                  }
                  puVar22 = (uint *)((long)local_128 + 1);
                  pMVar11 = local_150;
                } while (puVar22 < local_130);
              }
              local_158 = (uint *)((long)local_158 + 1);
            } while (local_158 < local_40);
          }
          goto LAB_001b8e68;
        }
      }
      else {
        Mat::clone(&local_118,(__fn *)&local_d0,(void *)0x0,local_a0,(void *)(ulong)local_16c[3]);
        pMVar11 = local_150;
        if (local_150 != &local_118) {
          if (local_118.refcount != (int *)0x0) {
            LOCK();
            *local_118.refcount = *local_118.refcount + 1;
            UNLOCK();
          }
          piVar2 = local_150->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar11->data = local_118.data;
          pMVar11->refcount = local_118.refcount;
          pMVar11->elemsize = local_118.elemsize;
          pMVar11->elempack = local_118.elempack;
          pMVar11->allocator = local_118.allocator;
          pMVar11->dims = local_118.dims;
          pMVar11->w = local_118.w;
          pMVar11->h = local_118.h;
          pMVar11->d = local_118.d;
          pMVar11->c = local_118.c;
          pMVar11->cstep = local_118.cstep;
        }
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + -1;
          UNLOCK();
          if (*local_118.refcount == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              if (local_118.data != (void *)0x0) {
                free(local_118.data);
              }
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0)) {
          iVar3 = -100;
        }
        else {
LAB_001b8e68:
          iVar3 = 0;
        }
      }
      if (local_c8 == (int *)0x0) {
        return iVar3;
      }
      LOCK();
      *local_c8 = *local_c8 + -1;
      UNLOCK();
      if (*local_c8 != 0) {
        return iVar3;
      }
      if (local_b0 != (Allocator *)0x0) {
        (*local_b0->_vptr_Allocator[3])();
        return iVar3;
      }
      goto LAB_001b8eab;
    }
LAB_001b83a7:
    if (local_150 == src) {
      return 0;
    }
    goto LAB_001b83da;
  default:
    goto LAB_001b8c77;
  }
  if (local_150 == src) {
    return 0;
  }
LAB_001b83da:
  piVar2 = src->refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  piVar2 = local_150->refcount;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_150->allocator == (Allocator *)0x0) {
        if (local_150->data != (void *)0x0) {
          free(local_150->data);
        }
      }
      else {
        (*local_150->allocator->_vptr_Allocator[3])();
      }
    }
  }
  pMVar11->cstep = 0;
  pMVar11->data = (void *)0x0;
  pMVar11->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar11->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar11->elemsize + 4) = 0;
  pMVar11->dims = 0;
  pMVar11->w = 0;
  pMVar11->h = 0;
  pMVar11->d = 0;
  pMVar11->c = 0;
  piVar2 = src->refcount;
  pMVar11->data = src->data;
  pMVar11->refcount = piVar2;
  pMVar11->elemsize = src->elemsize;
  pMVar11->elempack = src->elempack;
  pMVar11->allocator = src->allocator;
  iVar3 = src->w;
  iVar7 = src->h;
  iVar6 = src->d;
  pMVar11->dims = src->dims;
  pMVar11->w = iVar3;
  pMVar11->h = iVar7;
  pMVar11->d = iVar6;
  pMVar11->c = src->c;
  pMVar11->cstep = src->cstep;
LAB_001b8c77:
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}